

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int float64_unordered_quiet_arm(float64 a,float64 b,float_status *status)

{
  uint64_t a_1;
  float64 fVar1;
  float64 fVar2;
  int iVar3;
  
  fVar1 = float64_squash_input_denormal_arm(a,status);
  fVar2 = float64_squash_input_denormal_arm(b,status);
  if (((~fVar1 & 0x7ff0000000000000) == 0 && (fVar1 & 0xfffffffffffff) != 0) ||
     (iVar3 = 0, (fVar2 & 0xfffffffffffff) != 0 && (~fVar2 & 0x7ff0000000000000) == 0)) {
    iVar3 = 1;
    if (((fVar1 & 0x7ff8000000000000) == 0x7ff0000000000000 && (fVar1 & 0x7ffffffffffff) != 0) ||
       ((fVar2 & 0x7ffffffffffff) != 0 && (fVar2 & 0x7ff8000000000000) == 0x7ff0000000000000)) {
      status->float_exception_flags = status->float_exception_flags | 1;
    }
  }
  return iVar3;
}

Assistant:

int float64_unordered_quiet(float64 a, float64 b, float_status *status)
{
    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);

    if (    ( ( extractFloat64Exp( a ) == 0x7FF ) && extractFloat64Frac( a ) )
         || ( ( extractFloat64Exp( b ) == 0x7FF ) && extractFloat64Frac( b ) )
       ) {
        if (float64_is_signaling_nan(a, status)
         || float64_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 1;
    }
    return 0;
}